

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O3

Vec_Int_t * Abc_GraphGrid(int n)

{
  int iVar1;
  Vec_Int_t *p;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int local_38;
  
  iVar1 = n + -1;
  p = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < n * iVar1 * 4 - 1U) {
    iVar4 = n * iVar1 * 4;
  }
  p->nSize = 0;
  p->nCap = iVar4;
  if (iVar4 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar4 << 2);
  }
  p->pArray = piVar2;
  if (0 < n) {
    local_38 = 0;
    iVar4 = 0;
    while( true ) {
      iVar3 = local_38;
      iVar5 = iVar1;
      if (n != 1) {
        do {
          Vec_IntPush(p,iVar3);
          Vec_IntPush(p,iVar3 + 1);
          iVar5 = iVar5 + -1;
          iVar3 = iVar3 + 1;
        } while (iVar5 != 0);
      }
      iVar3 = local_38;
      iVar5 = n;
      if (iVar4 == iVar1) break;
      do {
        Vec_IntPush(p,iVar3);
        Vec_IntPush(p,n + iVar3);
        iVar5 = iVar5 + -1;
        iVar3 = iVar3 + 1;
      } while (iVar5 != 0);
      iVar4 = iVar4 + 1;
      local_38 = local_38 + n;
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_GraphGrid( int n )
{
    Vec_Int_t * vEdges = Vec_IntAlloc( 4*n*(n-1) ); // two nodes per edge
    int i, k;
    for ( i = 0; i < n; i++ )
    {
        for ( k = 0; k < n-1; k++ )
            Vec_IntPushTwo( vEdges, i*n+k, i*n+k+1 );
        if ( i == n-1 ) break;
        for ( k = 0; k < n; k++ )
            Vec_IntPushTwo( vEdges, i*n+k, i*n+k+n );
    }
    //Vec_IntPrint( vEdges );
    return vEdges;
}